

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

int __thiscall Patch::Node::copy(Node *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Point old_extent;
  Point new_extent;
  Text *pTVar1;
  uint32_t uVar2;
  Node *this_00;
  _Head_base<0UL,_Text_*,_false> _Var3;
  __uniq_ptr_impl<Text,_std::default_delete<Text>_> local_60;
  __uniq_ptr_impl<Text,_std::default_delete<Text>_> local_58;
  Point local_50;
  Node *local_48;
  Node *local_40;
  Point local_38;
  
  this_00 = (Node *)operator_new(0x50);
  local_40 = this->left;
  local_48 = this->right;
  old_extent = this->old_extent;
  new_extent = this->new_extent;
  local_50 = this->old_distance_from_left_ancestor;
  local_38 = this->new_distance_from_left_ancestor;
  pTVar1 = (this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
           super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
           super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  if (pTVar1 == (Text *)0x0) {
    _Var3._M_head_impl = (Text *)0x0;
  }
  else {
    _Var3._M_head_impl = (Text *)operator_new(0x38);
    Text::Text(_Var3._M_head_impl,pTVar1);
  }
  pTVar1 = (this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
           super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
           super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  local_60._M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
  super__Head_base<0UL,_Text_*,_false>._M_head_impl =
       (tuple<Text_*,_std::default_delete<Text>_>)
       (tuple<Text_*,_std::default_delete<Text>_>)_Var3._M_head_impl;
  if (pTVar1 == (Text *)0x0) {
    _Var3._M_head_impl = (Text *)0x0;
  }
  else {
    _Var3._M_head_impl = (Text *)operator_new(0x38);
    Text::Text(_Var3._M_head_impl,pTVar1);
  }
  local_58._M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
  super__Head_base<0UL,_Text_*,_false>._M_head_impl =
       (tuple<Text_*,_std::default_delete<Text>_>)
       (tuple<Text_*,_std::default_delete<Text>_>)_Var3._M_head_impl;
  Node(this_00,local_40,local_48,old_extent,new_extent,local_50,local_38,
       (unique_ptr<Text,_std::default_delete<Text>_> *)&local_60,
       (unique_ptr<Text,_std::default_delete<Text>_> *)&local_58,this->old_text_size_);
  std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr
            ((unique_ptr<Text,_std::default_delete<Text>_> *)&local_58);
  std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr
            ((unique_ptr<Text,_std::default_delete<Text>_> *)&local_60);
  uVar2 = this->new_subtree_text_size;
  this_00->old_subtree_text_size = this->old_subtree_text_size;
  this_00->new_subtree_text_size = uVar2;
  return (int)this_00;
}

Assistant:

Node *copy() {
    auto result = new Node{
      left,
      right,
      old_extent,
      new_extent,
      old_distance_from_left_ancestor,
      new_distance_from_left_ancestor,
      old_text ? unique_ptr<Text>(new Text(*old_text)) : nullptr,
      new_text ? unique_ptr<Text>(new Text(*new_text)) : nullptr,
      old_text_size_,
    };
    result->old_subtree_text_size = old_subtree_text_size;
    result->new_subtree_text_size = new_subtree_text_size;
    return result;
  }